

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

void __thiscall
compiler::CompilerAstWalker::onExitWhileStatementAstNode
          (CompilerAstWalker *this,WhileStatementAstNode *param_1)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer *ppuVar2;
  element_type *peVar3;
  pointer puVar4;
  pointer puVar5;
  pointer pBVar6;
  ulong *puVar7;
  iterator iVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  ByteCode bc;
  unsigned_long local_50;
  size_t loopStartIndex;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> vec;
  
  peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar4 = (peVar3->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (peVar3->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  p_Var1 = &vec.
            super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  loopStartIndex = (size_t)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&loopStartIndex,
             "onExitWhileStatementAstNode encountered while exit statement but loopStartIndices is empty"
             ,"");
  Error::assertWithPanic(puVar4 != puVar5,(string *)&loopStartIndex);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)loopStartIndex != p_Var1) {
    operator_delete((void *)loopStartIndex,
                    (ulong)((long)&(vec.
                                    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar4 = (peVar3->loopConditionEvalJumpIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (peVar3->loopConditionEvalJumpIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  loopStartIndex = (size_t)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&loopStartIndex,
             "onExitWhileStatementAstNode encountered while exit statement but loopConditionEvalJumpIndices is empty"
             ,"");
  Error::assertWithPanic(puVar4 != puVar5,(string *)&loopStartIndex);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)loopStartIndex != p_Var1) {
    operator_delete((void *)loopStartIndex,
                    (ulong)((long)&(vec.
                                    super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar4 = (peVar3->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (peVar3->loopStartIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar10 = (long)puVar5 - (long)puVar4 >> 3;
  if (puVar5 != puVar4) {
    local_50 = puVar4[lVar10 + -1];
    puVar4 = (peVar3->loopConditionEvalJumpIndices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (peVar3->loopConditionEvalJumpIndices).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    lVar10 = (long)puVar5 - (long)puVar4 >> 3;
    if (puVar5 != puVar4) {
      uVar13 = puVar4[lVar10 + -1];
      iVar8 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(peVar3->breakStatementsForLoops)._M_h,&local_50);
      loopStartIndex = 0;
      vec.
      super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      if (iVar8.
          super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
          ._M_cur != (__node_type *)0x0) {
        loopStartIndex =
             *(size_t *)
              ((long)iVar8.
                     super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                     ._M_cur + 0x10);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vec,
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)iVar8.
                          super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_false>
                          ._M_cur + 0x18));
      }
      bc.parameter = local_50;
      bc._0_8_ = 7;
      EmissionContext::EmitByteCode
                ((this->ec).
                 super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr,bc
                );
      peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      pBVar6 = (peVar3->byteCode).
               super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar11 = (long)(peVar3->byteCode).
                     super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar6 >> 4;
      if (uVar13 < uVar11) {
        *(ulong *)((long)(pBVar6 + uVar13) + 8) = uVar11;
        if (loopStartIndex != 0) {
          puVar7 = *(ulong **)(loopStartIndex + 8);
          for (puVar12 = *(ulong **)loopStartIndex; puVar12 != puVar7; puVar12 = puVar12 + 1) {
            uVar13 = *puVar12;
            if (uVar11 <= uVar13) goto LAB_0011b2f6;
            *(ulong *)((long)(pBVar6 + uVar13) + 8) = uVar11;
          }
        }
        ppuVar2 = &(peVar3->loopStartIndices).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar2 = *ppuVar2 + -1;
        ppuVar2 = &(peVar3->loopConditionEvalJumpIndices).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppuVar2 = *ppuVar2 + -1;
        if (vec.
            super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     vec.
                     super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
        }
        return;
      }
      goto LAB_0011b2f6;
    }
  }
  uVar13 = lVar10 - 1;
LAB_0011b2f6:
  uVar9 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar13);
  __clang_call_terminate(uVar9);
}

Assistant:

void onExitWhileStatementAstNode(WhileStatementAstNode*  /*node*/) noexcept override {
    Error::assertWithPanic(!this->ec->loopStartIndices.empty(),
      "onExitWhileStatementAstNode encountered while exit statement but loopStartIndices is empty");

    Error::assertWithPanic(!this->ec->loopConditionEvalJumpIndices.empty(),
      "onExitWhileStatementAstNode encountered while exit statement but loopConditionEvalJumpIndices is empty");

    std::size_t loopStartIndex = this->ec->loopStartIndices.at(this->ec->loopStartIndices.size() - 1);
    std::size_t loopJumpIfFalseIndex = this->ec->loopConditionEvalJumpIndices.at(this->ec->loopConditionEvalJumpIndices.size() - 1);

    auto find = this->ec->breakStatementsForLoops.find(loopStartIndex);

    std::shared_ptr<std::vector<std::size_t>> vec = nullptr;

    if (find != this->ec->breakStatementsForLoops.end()) {
      vec = find->second;
    }

    this->emit(bytecode::ByteCodeInstruction::Jump, loopStartIndex);

    std::size_t loopEnd = this->ec->byteCode.size();

    this->ec->UpdateParameterAtIndex(loopJumpIfFalseIndex, loopEnd);

    if (vec != nullptr) {
      for (const auto breakIndex : *vec) {
        this->ec->UpdateParameterAtIndex(breakIndex, loopEnd);
      }
    }

    this->ec->loopStartIndices.pop_back();
    this->ec->loopConditionEvalJumpIndices.pop_back();
  }